

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageOneofFieldGenerator::GenerateSerializationCode
          (ImmutableLazyMessageOneofFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_ImmutableLazyMessageFieldGenerator).
                              super_ImmutableMessageFieldGenerator.variables_,
                     "if ($has_oneof_case_message$) {\n  output.writeBytes(\n      $number$, (($lazy_type$) $oneof_name$_).toByteString());\n}\n"
                    );
  return;
}

Assistant:

void ImmutableLazyMessageOneofFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  // Do not de-serialize lazy fields.
  printer->Print(variables_,
    "if ($has_oneof_case_message$) {\n"
    "  output.writeBytes(\n"
    "      $number$, (($lazy_type$) $oneof_name$_).toByteString());\n"
    "}\n");
}